

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mcu8str_ensure_dynamic_buffer(mcu8str *str)

{
  mcu8str *in_RDI;
  mcu8str str2;
  mcu8str *in_stack_ffffffffffffffe0;
  
  if (in_RDI->owns_memory == 0) {
    mcu8str_copy(in_stack_ffffffffffffffe0);
    mcu8str_swap((mcu8str *)&stack0xffffffffffffffe0,in_RDI);
  }
  return;
}

Assistant:

void mcu8str_ensure_dynamic_buffer( mcu8str* str )
  {
    if ( str->owns_memory )
      return;
    mcu8str str2 = mcu8str_copy( str );
    mcu8str_swap( &str2, str );
    assert( !str2.owns_memory );
    assert( str->owns_memory );
    //No need to call mcu8str_dealloc( &str2 ) since it does not own the memory
    //now.
  }